

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

char * __thiscall cmStateDirectory::GetProperty(cmStateDirectory *this,string *prop,bool chain)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  char *pcVar4;
  PointerType pBVar5;
  cmStateSnapshot *this_00;
  pointer this_01;
  _Alloc_hider _Var6;
  allocator local_99;
  cmStateSnapshot parent;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  child_dirs;
  undefined1 local_58 [40];
  
  if ((GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_)
     , iVar3 != 0)) {
    GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.field_2;
    GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_string_length = 0;
    GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
  }
  std::__cxx11::string::assign
            ((char *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
  bVar1 = std::operator==(prop,"PARENT_DIRECTORY");
  if (bVar1) {
    cmStateSnapshot::GetBuildsystemDirectoryParent(&parent,&this->Snapshot_);
    bVar1 = cmStateSnapshot::IsValid(&parent);
    if (!bVar1) {
      return "";
    }
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_58,&parent);
    pcVar4 = GetCurrentSource((cmStateDirectory *)local_58);
    return pcVar4;
  }
  _Var2 = std::operator==(prop,&kBINARY_DIR_abi_cxx11_);
  if (_Var2) {
    GetCurrentBinary(this);
  }
  else {
    _Var2 = std::operator==(prop,&kSOURCE_DIR_abi_cxx11_);
    if (!_Var2) {
      _Var2 = std::operator==(prop,&kSUBDIRECTORIES_abi_cxx11_);
      if (_Var2) {
        child_dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        child_dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        child_dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           (&this->DirectoryState);
        for (this_01 = (pBVar5->Children).
                       super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl
                       .super__Vector_impl_data._M_start;
            this_01 !=
            (pBVar5->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>
            ._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_58,this_01);
          pcVar4 = GetCurrentSource((cmStateDirectory *)local_58);
          std::__cxx11::string::string((string *)&parent,pcVar4,&local_99);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &child_dirs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parent);
          std::__cxx11::string::~string((string *)&parent);
        }
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)local_58,&child_dirs,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (string *)local_58);
        std::__cxx11::string::~string((string *)local_58);
        this_00 = (cmStateSnapshot *)&child_dirs;
        _Var6 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
      }
      else {
        _Var2 = std::operator==(prop,&kBUILDSYSTEM_TARGETS_abi_cxx11_);
        if (_Var2) {
          pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                             (&this->DirectoryState);
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_58,&pBVar5->NormalTargetNames,";");
LAB_0032e3f8:
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                     (string *)local_58);
          std::__cxx11::string::~string((string *)local_58);
          return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
        }
        bVar1 = std::operator==(prop,"LISTFILE_STACK");
        if (bVar1) {
          parent.Position.Position = 0;
          parent._0_16_ = ZEXT816(0);
          child_dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(this->Snapshot_).Position.Position;
          child_dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(this->Snapshot_).State;
          child_dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(this->Snapshot_).Position.Tree;
          while (bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)&child_dirs), bVar1) {
            cmStateSnapshot::GetExecutionListFile_abi_cxx11_
                      ((string *)local_58,(cmStateSnapshot *)&child_dirs);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parent,
                       (string *)local_58);
            std::__cxx11::string::~string((string *)local_58);
            cmStateSnapshot::GetCallStackParent
                      ((cmStateSnapshot *)local_58,(cmStateSnapshot *)&child_dirs);
            child_dirs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_58._16_8_;
            child_dirs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_58._0_8_;
            child_dirs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
          }
          std::
          __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (parent.State,parent.Position.Tree);
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_58,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&parent,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                     (string *)local_58);
          std::__cxx11::string::~string((string *)local_58);
          _Var6 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
        }
        else {
          bVar1 = std::operator==(prop,"CACHE_VARIABLES");
          if (bVar1) {
            cmState::GetCacheEntryKeys_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&parent,(this->Snapshot_).State);
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((string *)local_58,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&parent,";");
            std::__cxx11::string::operator=
                      ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                       (string *)local_58);
            std::__cxx11::string::~string((string *)local_58);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&parent);
            return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p
            ;
          }
          bVar1 = std::operator==(prop,"VARIABLES");
          if (!bVar1) {
            bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
            if (bVar1) {
              parent._0_16_ = GetIncludeDirectoriesEntries_abi_cxx11_(this);
            }
            else {
              bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
              if (bVar1) {
                parent._0_16_ = GetCompileOptionsEntries_abi_cxx11_(this);
              }
              else {
                bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
                if (!bVar1) {
                  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                           operator->(&this->DirectoryState);
                  pcVar4 = cmPropertyMap::GetPropertyValue(&pBVar5->Properties,prop);
                  if (!chain || pcVar4 != (char *)0x0) {
                    return pcVar4;
                  }
                  cmStateSnapshot::GetBuildsystemDirectoryParent(&parent,&this->Snapshot_);
                  bVar1 = cmStateSnapshot::IsValid(&parent);
                  if (bVar1) {
                    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_58,&parent);
                    pcVar4 = GetProperty((cmStateDirectory *)local_58,prop,true);
                    return pcVar4;
                  }
                  pcVar4 = cmState::GetGlobalProperty((this->Snapshot_).State,prop);
                  return pcVar4;
                }
                parent._0_16_ = GetCompileDefinitionsEntries_abi_cxx11_(this);
              }
            }
            cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                      ((string *)local_58,
                       (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&parent,";");
            goto LAB_0032e3f8;
          }
          cmStateSnapshot::ClosureKeys_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&parent,&this->Snapshot_);
          cmState::GetCacheEntryKeys_abi_cxx11_(&child_dirs,(this->Snapshot_).State);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parent,
                     (const_iterator)parent.Position.Tree,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )child_dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )child_dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          std::
          __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (parent.State,parent.Position.Tree);
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_58,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&parent,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                     (string *)local_58);
          std::__cxx11::string::~string((string *)local_58);
          _Var6 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&child_dirs);
        }
        this_00 = &parent;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
      return _Var6._M_p;
    }
    GetCurrentSource(this);
  }
  std::__cxx11::string::assign
            ((char *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
  return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
}

Assistant:

const char* cmStateDirectory::GetProperty(const std::string& prop,
                                          bool chain) const
{
  static std::string output;
  output = "";
  if (prop == "PARENT_DIRECTORY") {
    cmStateSnapshot parent = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parent.IsValid()) {
      return parent.GetDirectory().GetCurrentSource();
    }
    return "";
  }
  if (prop == kBINARY_DIR) {
    output = this->GetCurrentBinary();
    return output.c_str();
  }
  if (prop == kSOURCE_DIR) {
    output = this->GetCurrentSource();
    return output.c_str();
  }
  if (prop == kSUBDIRECTORIES) {
    std::vector<std::string> child_dirs;
    std::vector<cmStateSnapshot> const& children =
      this->DirectoryState->Children;
    for (std::vector<cmStateSnapshot>::const_iterator ci = children.begin();
         ci != children.end(); ++ci) {
      child_dirs.push_back(ci->GetDirectory().GetCurrentSource());
    }
    output = cmJoin(child_dirs, ";");
    return output.c_str();
  }
  if (prop == kBUILDSYSTEM_TARGETS) {
    output = cmJoin(this->DirectoryState->NormalTargetNames, ";");
    return output.c_str();
  }

  if (prop == "LISTFILE_STACK") {
    std::vector<std::string> listFiles;
    cmStateSnapshot snp = this->Snapshot_;
    while (snp.IsValid()) {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
    }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmJoin(listFiles, ";");
    return output.c_str();
  }
  if (prop == "CACHE_VARIABLES") {
    output = cmJoin(this->Snapshot_.State->GetCacheEntryKeys(), ";");
    return output.c_str();
  }
  if (prop == "VARIABLES") {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    std::vector<std::string> cacheKeys =
      this->Snapshot_.State->GetCacheEntryKeys();
    res.insert(res.end(), cacheKeys.begin(), cacheKeys.end());
    std::sort(res.begin(), res.end());
    output = cmJoin(res, ";");
    return output.c_str();
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    output = cmJoin(this->GetIncludeDirectoriesEntries(), ";");
    return output.c_str();
  }
  if (prop == "COMPILE_OPTIONS") {
    output = cmJoin(this->GetCompileOptionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "COMPILE_DEFINITIONS") {
    output = cmJoin(this->GetCompileDefinitionsEntries(), ";");
    return output.c_str();
  }

  const char* retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain) {
    cmStateSnapshot parentSnapshot =
      this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid()) {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
    }
    return this->Snapshot_.State->GetGlobalProperty(prop);
  }

  return retVal;
}